

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O1

void __thiscall
asmjit::v1_14::RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder>::_logNode
          (RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *this,BaseNode *node,uint32_t indentation
          ,char *action)

{
  StringTmp<512UL> *this_00;
  ulong uVar1;
  undefined1 *puVar2;
  
  this_00 = &this->_sb;
  String::clear((String *)this_00);
  String::_opChars((String *)this_00,kAppend,' ',(ulong)indentation);
  if (action != (char *)0x0) {
    String::_opString((String *)this_00,kAppend,action,0xffffffffffffffff);
    String::_opChar((String *)this_00,kAppend,' ');
  }
  Formatter::formatNode((String *)this_00,&this->_formatOptions,&this->_cc->super_BaseBuilder,node);
  String::_opChar((String *)this_00,kAppend,'\n');
  uVar1 = (ulong)(byte)this->_sb;
  if (uVar1 < 0x1f) {
    puVar2 = &this->field_0x69;
  }
  else {
    uVar1 = *(ulong *)&this->field_0x70;
    puVar2 = *(undefined1 **)&this->field_0x80;
  }
  (*this->_logger->_vptr_Logger[2])(this->_logger,puVar2,uVar1);
  return;
}

Assistant:

void _logNode(BaseNode* node, uint32_t indentation, const char* action) noexcept {
    _sb.clear();
    _sb.appendChars(' ', indentation);
    if (action) {
      _sb.append(action);
      _sb.append(' ');
    }
    Formatter::formatNode(_sb, _formatOptions, cc(), node);
    _sb.append('\n');
    _logger->log(_sb);
  }